

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O1

void __thiscall duckdb::WriteAheadLogDeserializer::ReplayDelete(WriteAheadLogDeserializer *this)

{
  BinaryDeserializer *deserializer;
  data_ptr_t pdVar1;
  int iVar2;
  reference pvVar3;
  undefined4 extraout_var;
  InternalException *this_00;
  optional_ptr<duckdb::TableCatalogEntry,_true> *this_01;
  ulong uVar4;
  row_t row_ids [1];
  DataChunk chunk;
  Vector row_identifiers;
  TableDeleteState delete_state;
  undefined8 local_160;
  LogicalType local_158;
  DataChunk local_140;
  Vector local_100;
  TableDeleteState local_98;
  
  DataChunk::DataChunk(&local_140);
  deserializer = &this->deserializer;
  (*(this->deserializer).super_Deserializer._vptr_Deserializer[2])(deserializer,0x65,"chunk");
  (*(deserializer->super_Deserializer)._vptr_Deserializer[6])(deserializer);
  DataChunk::Deserialize(&local_140,&deserializer->super_Deserializer);
  (*(deserializer->super_Deserializer)._vptr_Deserializer[7])(deserializer);
  (*(deserializer->super_Deserializer)._vptr_Deserializer[3])(deserializer);
  if (this->deserialize_only == false) {
    if ((this->state->current_table).ptr == (TableCatalogEntry *)0x0) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_100._0_8_ = &local_100.type.type_info_;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_100,"Corrupt WAL: delete without table","");
      InternalException::InternalException(this_00,(string *)&local_100);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    LogicalType::LogicalType(&local_158,BIGINT);
    Vector::Vector(&local_100,&local_158,(data_ptr_t)&local_160);
    LogicalType::~LogicalType(&local_158);
    pvVar3 = vector<duckdb::Vector,_true>::operator[](&local_140.data,0);
    pdVar1 = pvVar3->data;
    local_98.has_delete_constraints = false;
    local_98.constraint_state.
    super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>._M_t.
    super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
    .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>)
         (__uniq_ptr_data<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>,_true,_true>
          )0x0;
    DataChunk::DataChunk(&local_98.verify_chunk);
    local_98.col_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
    super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.col_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
    super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.col_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
    super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_140.count != 0) {
      uVar4 = 0;
      do {
        local_160 = *(undefined8 *)(pdVar1 + uVar4 * 8);
        this_01 = &this->state->current_table;
        optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid(this_01);
        iVar2 = (*(this_01->ptr->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                  _vptr_CatalogEntry[0x10])();
        DataTable::Delete((DataTable *)CONCAT44(extraout_var,iVar2),&local_98,this->context,
                          &local_100,1);
        uVar4 = uVar4 + 1;
      } while (uVar4 < local_140.count);
    }
    ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector
              (&local_98.col_ids.
                super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>);
    DataChunk::~DataChunk(&local_98.verify_chunk);
    if (local_98.constraint_state.
        super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
        .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>,_true,_true>
         )0x0) {
      operator_delete((void *)local_98.constraint_state.
                              super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
                              .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl)
      ;
    }
    if (local_100.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_100.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType((LogicalType *)((long)&local_100 + 8));
  }
  DataChunk::~DataChunk(&local_140);
  return;
}

Assistant:

void WriteAheadLogDeserializer::ReplayDelete() {
	DataChunk chunk;
	deserializer.ReadObject(101, "chunk", [&](Deserializer &object) { chunk.Deserialize(object); });
	if (DeserializeOnly()) {
		return;
	}
	if (!state.current_table) {
		throw InternalException("Corrupt WAL: delete without table");
	}

	D_ASSERT(chunk.ColumnCount() == 1 && chunk.data[0].GetType() == LogicalType::ROW_TYPE);
	row_t row_ids[1];
	Vector row_identifiers(LogicalType::ROW_TYPE, data_ptr_cast(row_ids));

	auto source_ids = FlatVector::GetData<row_t>(chunk.data[0]);
	// delete the tuples from the current table
	TableDeleteState delete_state;
	for (idx_t i = 0; i < chunk.size(); i++) {
		row_ids[0] = source_ids[i];
		state.current_table->GetStorage().Delete(delete_state, context, row_identifiers, 1);
	}
}